

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

int __thiscall FBlockLinesIterator::init(FBlockLinesIterator *this,EVP_PKEY_CTX *ctx)

{
  double dVar1;
  double dVar2;
  int extraout_EAX;
  int y;
  int x;
  
  validcount = validcount + 1;
  dVar2 = *(double *)(ctx + 0x18) - bmaporgx;
  dVar1 = *(double *)ctx - bmaporgy;
  y = (int)((*(double *)(ctx + 8) - bmaporgy) * 0.0078125);
  x = (int)((*(double *)(ctx + 0x10) - bmaporgx) * 0.0078125);
  this->minx = x;
  this->maxx = (int)(dVar2 * 0.0078125);
  this->miny = y;
  this->maxy = (int)(dVar1 * 0.0078125);
  StartBlock(this,x,y);
  return extraout_EAX;
}

Assistant:

void FBlockLinesIterator::init(const FBoundingBox &box)
{
	validcount++;
	maxy = GetBlockY(box.Top());
	miny = GetBlockY(box.Bottom());
	maxx = GetBlockX(box.Right());
	minx = GetBlockX(box.Left());
	Reset();
}